

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O3

REF_STATUS ref_edge_ghost_dbl(REF_EDGE ref_edge,REF_MPI ref_mpi,REF_DBL *data,REF_INT dim)

{
  REF_NODE pRVar1;
  REF_MPI pRVar2;
  uint uVar3;
  REF_INT *send_size;
  REF_INT *pRVar4;
  long lVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  undefined8 uVar9;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  size_t __size;
  int iVar13;
  long lVar14;
  ulong uVar15;
  REF_INT node1;
  REF_INT node0;
  uint local_c0;
  int local_bc;
  ulong local_b8;
  REF_NODE local_b0;
  void *local_a8;
  REF_MPI local_a0;
  REF_INT *local_98;
  void *local_90;
  void *local_88;
  long local_80;
  void *local_78;
  void *local_70;
  REF_INT local_68;
  REF_INT local_64;
  undefined4 *local_60;
  REF_DBL *local_58;
  long local_50;
  size_t local_48;
  long local_40;
  ulong local_38;
  
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  pRVar1 = ref_edge->node;
  __size = (long)ref_mpi->n << 2;
  local_a0 = ref_mpi;
  send_size = (REF_INT *)calloc(1,__size);
  if (send_size == (REF_INT *)0x0) {
    pcVar11 = "malloc a_size of REF_INT NULL";
    uVar9 = 0x1d4;
    goto LAB_001407f0;
  }
  pRVar4 = (REF_INT *)calloc(1,__size);
  if (pRVar4 == (REF_INT *)0x0) {
    pcVar11 = "malloc b_size of REF_INT NULL";
    uVar9 = 0x1d5;
    goto LAB_001407f0;
  }
  iVar8 = ref_edge->n;
  local_b0 = pRVar1;
  local_98 = pRVar4;
  local_58 = data;
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  else {
    local_a8 = (void *)CONCAT44(local_a8._4_4_,dim);
    uVar3 = local_a0->id;
    iVar13 = 0;
    do {
      ref_edge_part(ref_edge,iVar13,(REF_INT *)&local_c0);
      if (local_c0 != uVar3) {
        send_size[(int)local_c0] = send_size[(int)local_c0] + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar8 != iVar13);
    dim = (uint)local_a8;
  }
  pRVar2 = local_a0;
  local_bc = iVar8;
  uVar3 = ref_mpi_alltoall(local_a0,send_size,local_98,1);
  if (uVar3 != 0) {
    pcVar11 = "alltoall sizes";
    uVar9 = 0x1dd;
LAB_00140848:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar9,
           "ref_edge_ghost_dbl",(ulong)uVar3,pcVar11);
    return uVar3;
  }
  uVar3 = pRVar2->n;
  lVar14 = (long)(int)uVar3;
  if (lVar14 < 1) {
    uVar12 = 0;
  }
  else {
    lVar5 = 0;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + send_size[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar14 != lVar5);
    if ((int)uVar12 < 0) {
      pcVar11 = "malloc a_nodes of REF_GLOB negative";
      uVar9 = 0x1e1;
      goto LAB_00140994;
    }
  }
  pvVar6 = malloc((ulong)(uVar12 * 2) << 3);
  if (pvVar6 == (void *)0x0) {
    pcVar11 = "malloc a_nodes of REF_GLOB NULL";
    uVar9 = 0x1e1;
  }
  else {
    if ((int)(uVar12 * dim) < 0) {
      pcVar11 = "malloc a_data of REF_DBL negative";
      uVar9 = 0x1e2;
      goto LAB_00140994;
    }
    pvVar7 = malloc((ulong)(uVar12 * dim) << 3);
    if (pvVar7 == (void *)0x0) {
      pcVar11 = "malloc a_data of REF_DBL NULL";
      uVar9 = 0x1e2;
    }
    else {
      local_38 = (ulong)uVar12;
      local_70 = pvVar7;
      pvVar7 = malloc(local_38 * 4);
      if (pvVar7 == (void *)0x0) {
        pcVar11 = "malloc a_edge of REF_INT NULL";
        uVar9 = 0x1e3;
      }
      else {
        local_a8 = pvVar6;
        if ((int)uVar3 < 1) {
          uVar10 = 0;
        }
        else {
          lVar5 = 0;
          uVar10 = 0;
          do {
            uVar10 = uVar10 + local_98[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar14 != lVar5);
          if ((int)uVar10 < 0) {
            pcVar11 = "malloc b_nodes of REF_GLOB negative";
            uVar9 = 0x1e7;
            goto LAB_00140994;
          }
        }
        local_78 = pvVar7;
        pvVar6 = malloc((ulong)(uVar10 * 2) << 3);
        if (pvVar6 == (void *)0x0) {
          pcVar11 = "malloc b_nodes of REF_GLOB NULL";
          uVar9 = 0x1e7;
        }
        else {
          if ((int)(uVar10 * dim) < 0) {
            pcVar11 = "malloc b_data of REF_DBL negative";
            uVar9 = 0x1e8;
LAB_00140994:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                   uVar9,"ref_edge_ghost_dbl",pcVar11);
            return 1;
          }
          local_90 = pvVar6;
          pvVar6 = malloc((ulong)(uVar10 * dim) << 3);
          if (pvVar6 == (void *)0x0) {
            pcVar11 = "malloc b_data of REF_DBL NULL";
            uVar9 = 0x1e8;
          }
          else {
            if ((int)uVar3 < 0) {
              pcVar11 = "malloc a_next of REF_INT negative";
              uVar9 = 0x1ea;
              goto LAB_00140994;
            }
            local_88 = pvVar6;
            local_60 = (undefined4 *)malloc(lVar14 * 4);
            if (local_60 != (undefined4 *)0x0) {
              *local_60 = 0;
              local_c0 = 1;
              if (1 < uVar3) {
                lVar5 = 0;
                iVar8 = 0;
                do {
                  iVar8 = iVar8 + send_size[lVar5];
                  local_60[lVar5 + 1] = iVar8;
                  lVar5 = lVar5 + 1;
                  local_c0 = uVar3;
                } while (lVar14 + -1 != lVar5);
              }
              local_b8 = (ulong)ref_edge->n;
              if ((long)local_b8 < 1) {
                local_b8 = 0;
              }
              else {
                local_80 = CONCAT44(local_80._4_4_,local_a0->id);
                uVar15 = 0;
                do {
                  ref_edge_part(ref_edge,(REF_INT)uVar15,(REF_INT *)&local_c0);
                  if (local_c0 != (uint)local_80) {
                    iVar8 = local_60[(int)local_c0];
                    *(REF_INT *)((long)local_78 + (long)iVar8 * 4) = (REF_INT)uVar15;
                    pRVar4 = ref_edge->e2n;
                    iVar13 = pRVar4[uVar15 * 2];
                    lVar5 = -1;
                    lVar14 = -1;
                    if (((-1 < (long)iVar13) && (iVar13 < local_b0->max)) &&
                       (lVar14 = local_b0->global[iVar13], lVar14 < 0)) {
                      lVar14 = -1;
                    }
                    *(long *)((long)local_a8 + (long)iVar8 * 0x10) = lVar14;
                    iVar13 = pRVar4[uVar15 * 2 + 1];
                    if (((-1 < (long)iVar13) && (iVar13 < local_b0->max)) &&
                       (lVar5 = local_b0->global[iVar13], lVar5 < 0)) {
                      lVar5 = -1;
                    }
                    *(long *)((long)local_a8 + (long)(int)(iVar8 * 2 | 1) * 8) = lVar5;
                    local_60[(int)local_c0] = iVar8 + 1;
                  }
                  uVar15 = uVar15 + 1;
                } while (local_b8 != uVar15);
              }
              local_bc = (int)local_b8;
              uVar3 = ref_mpi_alltoallv(local_a0,local_a8,send_size,local_90,local_98,2,2);
              if (uVar3 == 0) {
                if (uVar10 != 0) {
                  local_48 = (ulong)(uint)dim << 3;
                  local_40 = (ulong)uVar10 << 4;
                  lVar14 = 0;
                  local_50 = (long)dim;
                  local_b8 = local_b8 & 0xffffffff00000000;
                  do {
                    pRVar1 = local_b0;
                    uVar3 = ref_node_local(local_b0,*(REF_GLOB *)((long)local_90 + lVar14),&local_64
                                          );
                    if (uVar3 != 0) {
                      pcVar11 = "loc 0";
                      uVar9 = 0x200;
                      goto LAB_00140848;
                    }
                    local_80 = lVar14;
                    uVar3 = ref_node_local(pRVar1,*(REF_GLOB *)((long)local_90 + lVar14 + 8),
                                           &local_68);
                    if (uVar3 != 0) {
                      pcVar11 = "loc 1";
                      uVar9 = 0x201;
                      goto LAB_00140848;
                    }
                    uVar3 = ref_edge_with(ref_edge,local_64,local_68,&local_bc);
                    if (uVar3 != 0) {
                      pcVar11 = "find edge";
                      uVar9 = 0x202;
                      goto LAB_00140848;
                    }
                    iVar8 = (int)local_b8;
                    if (0 < dim) {
                      memcpy((void *)((long)local_88 + (local_b8 & 0xffffffff) * 8),
                             local_58 + local_bc * local_50,local_48);
                    }
                    local_b8 = CONCAT44(local_b8._4_4_,iVar8 + dim);
                    lVar14 = local_80 + 0x10;
                  } while (local_40 != lVar14);
                }
                uVar3 = ref_mpi_alltoallv(local_a0,local_88,local_98,local_70,send_size,dim,3);
                if (uVar3 == 0) {
                  if (uVar12 != 0) {
                    uVar3 = 0;
                    uVar15 = 0;
                    do {
                      if (0 < dim) {
                        memcpy(local_58 + (long)*(int *)((long)local_78 + uVar15 * 4) * (long)dim,
                               (void *)((long)local_70 + (ulong)uVar3 * 8),(ulong)(uint)dim << 3);
                      }
                      uVar15 = uVar15 + 1;
                      uVar3 = uVar3 + dim;
                    } while (local_38 != uVar15);
                  }
                  free(local_60);
                  free(local_88);
                  free(local_90);
                  free(local_78);
                  free(local_70);
                  free(local_a8);
                  free(local_98);
                  free(send_size);
                  return 0;
                }
                pcVar11 = "alltoallv return data";
                uVar9 = 0x208;
              }
              else {
                pcVar11 = "alltoallv requested nodes";
                uVar9 = 0x1fd;
              }
              goto LAB_00140848;
            }
            pcVar11 = "malloc a_next of REF_INT NULL";
            uVar9 = 0x1ea;
          }
        }
      }
    }
  }
LAB_001407f0:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",uVar9,
         "ref_edge_ghost_dbl",pcVar11);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_edge_ghost_dbl(REF_EDGE ref_edge, REF_MPI ref_mpi,
                                      REF_DBL *data, REF_INT dim) {
  REF_NODE ref_node = ref_edge_node(ref_edge);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT edge;
  REF_INT part;
  REF_INT *a_next, *a_edge;
  REF_GLOB *a_nodes, *b_nodes;
  REF_DBL *a_data, *b_data;

  REF_INT node0, node1;
  REF_INT request;
  REF_INT i;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) a_size[part]++;
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_nodes, 2 * a_total, REF_GLOB);
  ref_malloc(a_data, dim * a_total, REF_DBL);
  ref_malloc(a_edge, a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_nodes, 2 * b_total, REF_GLOB);
  ref_malloc(b_data, dim * b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
    if (part != ref_mpi_rank(ref_mpi)) {
      a_edge[a_next[part]] = edge;
      a_nodes[0 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 0, edge));
      a_nodes[1 + 2 * a_next[part]] =
          ref_node_global(ref_node, ref_edge_e2n(ref_edge, 1, edge));
      (a_next[part])++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_nodes, a_size, b_nodes, b_size, 2,
                        REF_GLOB_TYPE),
      "alltoallv requested nodes");

  for (request = 0; request < b_total; request++) {
    RSS(ref_node_local(ref_node, b_nodes[0 + 2 * request], &node0), "loc 0");
    RSS(ref_node_local(ref_node, b_nodes[1 + 2 * request], &node1), "loc 1");
    RSS(ref_edge_with(ref_edge, node0, node1, &edge), "find edge");
    for (i = 0; i < dim; i++) b_data[i + dim * request] = data[i + dim * edge];
  }

  RSS(ref_mpi_alltoallv(ref_mpi, b_data, b_size, a_data, a_size, dim,
                        REF_DBL_TYPE),
      "alltoallv return data");

  for (request = 0; request < a_total; request++) {
    for (i = 0; i < dim; i++)
      data[i + dim * a_edge[request]] = a_data[i + dim * request];
  }

  ref_free(a_next);

  ref_free(b_data);
  ref_free(b_nodes);

  ref_free(a_edge);

  ref_free(a_data);
  ref_free(a_nodes);

  ref_free(b_size);
  ref_free(a_size);

  return REF_SUCCESS;
}